

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O0

void CB_ALGS::predict_or_learn<true>(cb *data,single_learner *base,example *ec)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  cb_class *pcVar5;
  ostream *this;
  void *this_00;
  size_t sVar6;
  wclass *pwVar7;
  long in_RDX;
  learner<char,_example> *in_RDI;
  size_t i;
  cb_to_cs *c;
  label ld;
  label *in_stack_00000178;
  label *in_stack_00000180;
  example *in_stack_00000188;
  cb_to_cs *in_stack_00000190;
  size_t in_stack_ffffffffffffffb0;
  example *in_stack_ffffffffffffffb8;
  ulong uVar8;
  ulong i_00;
  learner<char,_example> *this_01;
  cb_class *ld_00;
  
  ld_00 = *(cb_class **)(in_RDX + 0x6828);
  uVar2 = *(undefined8 *)(in_RDX + 0x6830);
  uVar3 = *(undefined8 *)(in_RDX + 0x6838);
  uVar4 = *(undefined8 *)(in_RDX + 0x6840);
  this_01 = in_RDI;
  pcVar5 = GEN_CS::get_observed_cost((label *)ld_00);
  *(cb_class **)(this_01 + 0x50) = pcVar5;
  if ((*(long *)(this_01 + 0x50) != 0) &&
     ((*(int *)(*(long *)(this_01 + 0x50) + 4) == 0 ||
      (*(uint *)(this_01 + 8) < *(uint *)(*(long *)(this_01 + 0x50) + 4))))) {
    this = std::operator<<((ostream *)&std::cerr,"invalid action: ");
    this_00 = (void *)std::ostream::operator<<(this,*(uint *)(*(long *)(this_01 + 0x50) + 4));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  GEN_CS::gen_cs_example<true>
            (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178);
  if (*(long *)this_01 != 1) {
    *(undefined8 *)(in_RDX + 0x6828) = *(undefined8 *)(in_RDI + 0x58);
    *(undefined8 *)(in_RDX + 0x6830) = *(undefined8 *)(in_RDI + 0x60);
    *(undefined8 *)(in_RDX + 0x6838) = *(undefined8 *)(in_RDI + 0x68);
    *(undefined8 *)(in_RDX + 0x6840) = *(undefined8 *)(in_RDI + 0x70);
    LEARNER::learner<char,_example>::learn
              (this_01,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    uVar8 = 0;
    while( true ) {
      i_00 = uVar8;
      sVar6 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&stack0xffffffffffffffc8);
      if (sVar6 <= uVar8) break;
      pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[]
                         ((v_array<COST_SENSITIVE::wclass> *)(in_RDI + 0x58),i_00);
      fVar1 = pwVar7->partial_prediction;
      pcVar5 = v_array<CB::cb_class>::operator[]
                         ((v_array<CB::cb_class> *)&stack0xffffffffffffffc8,i_00);
      pcVar5->partial_prediction = fVar1;
      uVar8 = i_00 + 1;
    }
    *(cb_class **)(in_RDX + 0x6828) = ld_00;
    *(undefined8 *)(in_RDX + 0x6830) = uVar2;
    *(undefined8 *)(in_RDX + 0x6838) = uVar3;
    *(undefined8 *)(in_RDX + 0x6840) = uVar4;
  }
  return;
}

Assistant:

void predict_or_learn(cb& data, single_learner& base, example& ec)
{
  CB::label ld = ec.l.cb;
  cb_to_cs& c = data.cbcs;
  c.known_cost = get_observed_cost(ld);
  if (c.known_cost != nullptr && (c.known_cost->action < 1 || c.known_cost->action > c.num_actions))
    cerr << "invalid action: " << c.known_cost->action << endl;

  // generate a cost-sensitive example to update classifiers
  gen_cs_example<is_learn>(c, ec, ld, data.cb_cs_ld);

  if (c.cb_type != CB_TYPE_DM)
  {
    ec.l.cs = data.cb_cs_ld;

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    for (size_t i = 0; i < ld.costs.size(); i++)
      ld.costs[i].partial_prediction = data.cb_cs_ld.costs[i].partial_prediction;
    ec.l.cb = ld;
  }
}